

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_key.cpp
# Opt level: O0

void __thiscall
cfdcapi_key_GetPubkeyFingerprint_Test::TestBody(cfdcapi_key_GetPubkeyFingerprint_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  char *str_buffer;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *output;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffdf8;
  AssertionResult *in_stack_fffffffffffffe00;
  CfdErrorCode *in_stack_fffffffffffffe08;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  void **in_stack_fffffffffffffe18;
  void *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe98;
  AssertHelper local_160;
  Message local_158;
  undefined4 local_14c;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined4 local_104;
  AssertionResult local_100;
  char *local_f0;
  AssertHelper local_e8;
  Message local_e0;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff68;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffe18);
  local_2c = 0;
  pAVar4 = &local_28;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffe18,
             (char *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08,(int *)in_stack_fffffffffffffe00);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!(bool)uVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36799a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x14f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3679fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x367a52);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(type *)0x367a86);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xffffffffffffff68,(internal *)&local_60,
               (AssertionResult *)"(NULL == handle)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x150,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    testing::Message::~Message((Message *)0x367b82);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x367bfd);
  pcVar3 = (char *)0x0;
  local_14 = CfdGetPubkeyFingerprint
                       (in_stack_ffffffffffffff68,(char *)0x0,
                        (char **)in_stack_ffffffffffffff58.ptr_);
  local_b4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffe18,
             (char *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08,(int *)in_stack_fffffffffffffe00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff50);
  if (!bVar2) {
    testing::Message::Message(&local_c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x367ccd);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x155,message);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x367d2a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x367d7f);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_d8,"\"7df5646a\"","output","7df5646a",pcVar3);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
    if (!bVar2) {
      testing::Message::Message(&local_e0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x367e22);
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x157,pcVar3);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      testing::Message::~Message((Message *)0x367e7f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x367ed4);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffe08);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffe38);
  if (local_14 != 0) {
    local_f0 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         ((void *)CONCAT17(uVar1,in_stack_fffffffffffffe98),(char **)pAVar4);
    local_104 = 0;
    pAVar4 = &local_100;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffe18,
               (char *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe08,(int *)in_stack_fffffffffffffe00);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar2) {
      testing::Message::Message(&local_110);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x367fce);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x15f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message((Message *)0x36802b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x368080);
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_128,"\"7df5646a\"","str_buffer","7df5646a",local_f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_128);
    if (!bVar2) {
      testing::Message::Message(&local_130);
      in_stack_fffffffffffffe18 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x368115);
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
                 ,0x160,(char *)in_stack_fffffffffffffe18);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      testing::Message::~Message((Message *)0x368172);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3681c7);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffe08);
    local_f0 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffe08);
  local_14c = 0;
  pAVar4 = &local_148;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffe18,
             (char *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
             (CfdErrorCode *)pAVar4,(int *)in_stack_fffffffffffffe00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar2) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x368297);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_key.cpp"
               ,0x166,pcVar3);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message((Message *)0x3682f4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x368349);
  return;
}

Assistant:

TEST(cfdcapi_key, GetPubkeyFingerprint) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* output = nullptr;
  ret = CfdGetPubkeyFingerprint(handle,
        "03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9", &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("7df5646a", output);
    CfdFreeStringBuffer(output);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("7df5646a", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}